

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool __thiscall Parameter<int>::internalSetData<int>(Parameter<int> *this,int data)

{
  bool bVar1;
  RepType in_ESI;
  long in_RDI;
  bool result;
  int tmp;
  RepType local_10 [4];
  
  local_10[0] = 0;
  bVar1 = ParameterTraits<int>::convert(in_ESI,local_10);
  if (bVar1) {
    *(undefined1 *)(in_RDI + 0x2a) = 0;
    *(RepType *)(in_RDI + 0x2c) = local_10[0];
  }
  return bVar1;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }